

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O1

void __thiscall amrex::MLMG::prepareForNSolve(MLMG *this)

{
  CFStrategy CVar1;
  MLLinOp *pMVar2;
  BoxArray *bxs;
  DistributionMapping *dm;
  FabFactory<amrex::FArrayBox> *pFVar3;
  MultiFab *pMVar4;
  FabArray<amrex::FArrayBox> *pFVar5;
  undefined8 uVar6;
  int ncomp;
  MultiFab *pMVar7;
  MLMG *pMVar8;
  int iVar9;
  pointer __p;
  int local_70;
  MFInfo local_68;
  DistributionMapping *local_38;
  
  (*this->linop->_vptr_MLLinOp[0x21])
            ((_Head_base<0UL,_amrex::MLLinOp_*,_false> *)&local_68,this->linop,
             (ulong)(uint)this->nsolve_grid_size);
  uVar6 = local_68._0_8_;
  local_68._0_8_ = (MLLinOp *)0x0;
  pMVar2 = (this->ns_linop)._M_t.
           super___uniq_ptr_impl<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MLLinOp_*,_std::default_delete<amrex::MLLinOp>_>.
           super__Head_base<0UL,_amrex::MLLinOp_*,_false>._M_head_impl;
  (this->ns_linop)._M_t.super___uniq_ptr_impl<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>.
  _M_t.super__Tuple_impl<0UL,_amrex::MLLinOp_*,_std::default_delete<amrex::MLLinOp>_>.
  super__Head_base<0UL,_amrex::MLLinOp_*,_false>._M_head_impl = (MLLinOp *)uVar6;
  if (pMVar2 != (MLLinOp *)0x0) {
    (*pMVar2->_vptr_MLLinOp[1])();
  }
  if ((MLLinOp *)local_68._0_8_ != (MLLinOp *)0x0) {
    (**(code **)(*(long *)local_68._0_8_ + 8))();
  }
  ncomp = (*this->linop->_vptr_MLLinOp[5])();
  local_70 = 0;
  if (this->cf_strategy == ghostnodes) {
    local_70 = (*this->linop->_vptr_MLLinOp[6])(this->linop,0,0);
  }
  pMVar2 = (this->ns_linop)._M_t.
           super___uniq_ptr_impl<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MLLinOp_*,_std::default_delete<amrex::MLLinOp>_>.
           super__Head_base<0UL,_amrex::MLLinOp_*,_false>._M_head_impl;
  bxs = (BoxArray *)
        **(undefined8 **)
          &(pMVar2->m_grids).
           super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
           .
           super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
  ;
  dm = (DistributionMapping *)
       **(undefined8 **)
         &(pMVar2->m_dmap).
          super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
          .
          super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
  ;
  CVar1 = this->cf_strategy;
  local_68._0_8_ = (MLLinOp *)0x1;
  local_68.arena = (Arena *)0x0;
  local_68.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pFVar3 = *(FabFactory<amrex::FArrayBox> **)
            **(undefined8 **)
              &(pMVar2->m_factory).
               super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
               .
               super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
  ;
  pMVar7 = (MultiFab *)operator_new(0x180);
  iVar9 = 1;
  if (CVar1 == ghostnodes) {
    iVar9 = local_70;
  }
  MultiFab::MultiFab(pMVar7,bxs,dm,ncomp,iVar9,&local_68,pFVar3);
  pMVar4 = (this->ns_sol)._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
           super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
  (this->ns_sol)._M_t.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
  _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = pMVar7;
  local_38 = dm;
  if (pMVar4 != (MultiFab *)0x0) {
    (**(code **)(*(long *)&(pMVar4->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8))();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_68.tags);
  CVar1 = this->cf_strategy;
  local_68._0_8_ = (MLLinOp *)0x1;
  local_68.arena = (Arena *)0x0;
  local_68.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pFVar3 = *(FabFactory<amrex::FArrayBox> **)
            **(undefined8 **)
              &(((this->ns_linop)._M_t.
                 super___uniq_ptr_impl<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::MLLinOp_*,_std::default_delete<amrex::MLLinOp>_>.
                 super__Head_base<0UL,_amrex::MLLinOp_*,_false>._M_head_impl)->m_factory).
               super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
               .
               super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
  ;
  pMVar7 = (MultiFab *)operator_new(0x180);
  iVar9 = 0;
  if (CVar1 == ghostnodes) {
    iVar9 = local_70;
  }
  MultiFab::MultiFab(pMVar7,bxs,local_38,ncomp,iVar9,&local_68,pFVar3);
  pMVar4 = (this->ns_rhs)._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
           super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
  (this->ns_rhs)._M_t.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
  _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = pMVar7;
  if (pMVar4 != (MultiFab *)0x0) {
    (**(code **)(*(long *)&(pMVar4->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8))();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_68.tags);
  pFVar5 = &((this->ns_sol)._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
             super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
            super_FabArray<amrex::FArrayBox>;
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (pFVar5,0.0,0,(pFVar5->super_FabArrayBase).n_comp,&(pFVar5->super_FabArrayBase).n_grow);
  pFVar5 = &((this->ns_rhs)._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
             super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
            super_FabArray<amrex::FArrayBox>;
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (pFVar5,0.0,0,(pFVar5->super_FabArrayBase).n_comp,&(pFVar5->super_FabArrayBase).n_grow);
  pMVar2 = (this->ns_linop)._M_t.
           super___uniq_ptr_impl<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MLLinOp_*,_std::default_delete<amrex::MLLinOp>_>.
           super__Head_base<0UL,_amrex::MLLinOp_*,_false>._M_head_impl;
  (*pMVar2->_vptr_MLLinOp[3])
            (pMVar2,0,(this->ns_sol)._M_t.
                      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                      .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0,0,0);
  pMVar2 = (this->ns_linop)._M_t.
           super___uniq_ptr_impl<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MLLinOp_*,_std::default_delete<amrex::MLLinOp>_>.
           super__Head_base<0UL,_amrex::MLLinOp_*,_false>._M_head_impl;
  pMVar8 = (MLMG *)operator_new(0x198);
  MLMG(pMVar8,pMVar2);
  local_68._0_8_ = (MLLinOp *)0x0;
  std::__uniq_ptr_impl<amrex::MLMG,_std::default_delete<amrex::MLMG>_>::reset
            ((__uniq_ptr_impl<amrex::MLMG,_std::default_delete<amrex::MLMG>_> *)&this->ns_mlmg,
             pMVar8);
  std::unique_ptr<amrex::MLMG,_std::default_delete<amrex::MLMG>_>::~unique_ptr
            ((unique_ptr<amrex::MLMG,_std::default_delete<amrex::MLMG>_> *)&local_68);
  pMVar8 = (this->ns_mlmg)._M_t.
           super___uniq_ptr_impl<amrex::MLMG,_std::default_delete<amrex::MLMG>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MLMG_*,_std::default_delete<amrex::MLMG>_>.
           super__Head_base<0UL,_amrex::MLMG_*,_false>._M_head_impl;
  pMVar8->verbose = 0;
  pMVar8->do_fixed_number_of_iters = 1;
  pMVar8->max_fmg_iters = 0x14;
  pMVar8->bottom_solver = smoother;
  return;
}

Assistant:

void
MLMG::prepareForNSolve ()
{
    ns_linop = linop.makeNLinOp(nsolve_grid_size);

    const int ncomp = linop.getNComp();
    int nghost = 0;
    if (cf_strategy == CFStrategy::ghostnodes) nghost = linop.getNGrow();

    const BoxArray& ba = (*ns_linop).m_grids[0][0];
    const DistributionMapping& dm =(*ns_linop).m_dmap[0][0];

    int ng = 1;
    if (cf_strategy == CFStrategy::ghostnodes) ng = nghost;
    ns_sol = std::make_unique<MultiFab>(ba, dm, ncomp, ng, MFInfo(), *(ns_linop->Factory(0,0)));
    ng = 0;
    if (cf_strategy == CFStrategy::ghostnodes) ng = nghost;
    ns_rhs = std::make_unique<MultiFab>(ba, dm, ncomp, ng, MFInfo(), *(ns_linop->Factory(0,0)));
    ns_sol->setVal(0.0);
    ns_rhs->setVal(0.0);

    ns_linop->setLevelBC(0, ns_sol.get());

    ns_mlmg = std::make_unique<MLMG>(*ns_linop);
    ns_mlmg->setVerbose(0);
    ns_mlmg->setFixedIter(1);
    ns_mlmg->setMaxFmgIter(20);
    ns_mlmg->setBottomSolver(BottomSolver::smoother);
}